

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::internal::matrix_bidiagonalize<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *mat_b,double *mat_v,
               double *epsilon)

{
  double *pdVar1;
  size_t __n;
  undefined1 auVar2 [8];
  int iVar3;
  double *mat_a_00;
  int i_1;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  int iVar27;
  int i_2;
  uint uVar28;
  long lVar29;
  int iVar30;
  double *pdVar31;
  int iVar32;
  long lVar33;
  bool bVar34;
  undefined1 local_1f8 [8];
  vector<double,_std::allocator<double>_> buffer;
  double house_beta;
  undefined1 local_188 [8];
  vector<double,_std::allocator<double>_> buffer2;
  double inner_house_beta;
  long local_158;
  long local_140;
  long local_130;
  ulong local_120;
  double local_d8;
  double norm;
  long local_c8;
  long local_c0;
  double *local_b8;
  long local_b0;
  long local_a8;
  double *local_a0;
  long local_98;
  double *local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  double *local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  ulong local_48;
  int local_3c;
  long local_38;
  
  local_50 = mat_b;
  matrix_set_identity<double>(mat_u,rows);
  matrix_set_identity<double>(mat_v,cols);
  local_70 = (ulong)(uint)rows;
  local_60 = (ulong)(uint)cols;
  if (cols * rows != 0) {
    memmove(local_50,mat_a,(long)(cols * rows) << 3);
  }
  mat_a_00 = local_50;
  iVar32 = (int)local_70;
  iVar13 = (int)local_60;
  uVar17 = iVar13 - (uint)(iVar32 == iVar13);
  uVar5 = (ulong)(uint)(iVar32 * iVar32);
  uVar20 = iVar13 * iVar13;
  lVar24 = (long)iVar13;
  local_c8 = (long)iVar32;
  local_130 = 0;
  if ((int)uVar17 < 1) {
    uVar17 = 0;
  }
  local_c0 = local_c8 << 4;
  local_84 = iVar32 * -2 + 1;
  iVar27 = 2;
  local_80 = (2 - iVar13) - iVar32;
  local_7c = iVar13 * -2 + 3;
  lVar25 = lVar24 << 4;
  local_3c = iVar13 + -1;
  iVar18 = iVar32 * local_3c;
  uVar28 = local_3c * local_3c;
  __n = (ulong)uVar20 * 8;
  local_a8 = lVar24 * 8;
  local_158 = local_c8 * 8;
  uVar21 = local_70 & 0xffffffff;
  uVar22 = (ulong)(iVar13 + 1U);
  norm = (double)(local_60 & 0xffffffff);
  local_140 = lVar24 * 8;
  local_b0 = 1;
  local_98 = 1;
  local_a0 = local_50;
  local_b8 = local_50;
  local_78 = local_70 & 0xffffffff;
  local_48 = 0;
  uVar23 = uVar5;
  pdVar26 = local_50;
  local_120 = uVar22;
  while( true ) {
    local_140 = local_140 + -8;
    lVar25 = lVar25 + -0x10;
    if (local_48 == uVar17) break;
    local_50 = (double *)(lVar25 + (ulong)uVar28 * 8);
    lVar19 = (long)local_50 + (long)iVar18 * 8;
    lVar6 = (long)iVar18 * 0x10 + (long)local_50;
    lVar7 = (long)local_3c;
    local_58 = (double *)(local_c0 + uVar23 * 8);
    lVar29 = (long)(int)local_b0;
    pdVar31 = (double *)(local_a8 * lVar29 + (long)pdVar26);
    lVar8 = (long)iVar27;
    lVar16 = local_c8 - local_48;
    local_88 = (int)local_70 - (int)local_48;
    iVar4 = (int)lVar16;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f8,
               (long)((iVar4 + 2) * iVar4 + iVar32 * iVar32 * 2),(allocator_type *)local_188);
    auVar2 = local_1f8;
    local_90 = (double *)((long)local_1f8 + lVar16 * 8);
    local_68 = local_90 + lVar16;
    pdVar1 = local_68 + (uint)(iVar4 * iVar4);
    pdVar9 = local_b8;
    for (lVar11 = 0; lVar11 < lVar16; lVar11 = lVar11 + 1) {
      *(double *)((long)local_1f8 + lVar11 * 8) = *pdVar9;
      pdVar9 = (double *)((long)pdVar9 + local_a8);
    }
    local_188 = (undefined1  [8])&DAT_3ff0000000000000;
    local_38 = lVar16;
    matrix_householder_vector<double>
              ((double *)local_1f8,iVar4,local_90,
               (double *)
               &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,epsilon,(double *)local_188);
    matrix_householder_matrix<double>
              (local_90,(int)local_38,
               (double)buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,local_68);
    matrix_apply_householder_matrix<double>
              (mat_a_00,(int)local_70,(int)local_60,local_68,local_88,(int)local_48,(int)local_48);
    for (lVar11 = lVar29; lVar11 < local_c8; lVar11 = lVar11 + 1) {
      *pdVar31 = 0.0;
      pdVar31 = (double *)((long)pdVar31 + local_a8);
    }
    for (sVar10 = 0; uVar5 * 8 != sVar10; sVar10 = sVar10 + 8) {
      *(undefined8 *)((long)local_58 + (long)auVar2 + sVar10) = 0;
    }
    iVar4 = 0;
    uVar12 = local_48;
    while (bVar34 = uVar12 != 0, uVar12 = uVar12 - 1, bVar34) {
      pdVar1[iVar4] = 1.0;
      iVar4 = iVar4 + iVar32 + 1U;
    }
    lVar33 = (long)auVar2 + local_c0;
    lVar11 = local_130;
    for (lVar16 = 0; lVar16 < local_38; lVar16 = lVar16 + 1) {
      for (uVar12 = 0; local_78 != uVar12; uVar12 = uVar12 + 1) {
        pdVar1[(int)lVar11 + (int)uVar12] = *(double *)(lVar33 + uVar12 * 8);
      }
      lVar33 = lVar33 + local_158;
      lVar11 = lVar11 + uVar21;
    }
    if ((int)local_70 != 0) {
      memmove(pdVar1 + uVar5,mat_u,uVar5 * 8);
    }
    iVar4 = (int)local_70;
    matrix_multiply<double>(pdVar1 + uVar5,iVar4,iVar4,pdVar1,iVar4,mat_u);
    local_68 = (double *)(local_48 + 1);
    if ((long)local_48 <= (long)(iVar13 + -3)) {
      local_d8 = 0.0;
      for (; lVar29 < lVar24; lVar29 = lVar29 + 1) {
        local_d8 = local_d8 + local_a0[lVar29];
      }
      if ((0.0 - *epsilon <= local_d8) && (local_d8 <= *epsilon)) {
        local_d8 = 1.0;
      }
      lVar29 = lVar24 - (long)local_68;
      uVar15 = ~(uint)local_48 + (int)local_60;
      iVar4 = (int)lVar29;
      iVar30 = uVar15 * (int)local_38;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_188,
                 (long)(int)((iVar4 + 2) * iVar4 + (uVar20 + iVar30) * 2),
                 (allocator_type *)
                 &buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      auVar2 = local_188;
      local_58 = (double *)((long)local_188 + lVar29 * 8);
      local_90 = local_58 + lVar29;
      pdVar1 = local_90 + (uint)(iVar4 * iVar4);
      pdVar9 = pdVar1 + iVar30 + iVar30;
      lVar16 = (long)(int)uVar15;
      for (lVar11 = 0; lVar11 < lVar16; lVar11 = lVar11 + 1) {
        *(double *)((long)local_188 + lVar11 * 8) = mat_a_00[(int)local_98 + (int)lVar11];
      }
      local_48 = (ulong)uVar15;
      matrix_householder_vector<double>
                ((double *)local_188,iVar4,local_58,
                 (double *)
                 &buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,epsilon,&local_d8);
      matrix_householder_matrix<double>
                (local_58,iVar4,
                 (double)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_90);
      local_58 = pdVar9 + uVar20;
      lVar19 = lVar19 + (long)auVar2;
      lVar11 = local_98;
      for (lVar33 = 0; lVar33 < local_38; lVar33 = lVar33 + 1) {
        for (lVar14 = 0; lVar14 < lVar16; lVar14 = lVar14 + 1) {
          *(double *)(lVar19 + lVar14 * 8) = mat_a_00[(int)lVar11 + (int)lVar14];
        }
        lVar19 = lVar19 + lVar7 * 8;
        lVar11 = lVar11 + (long)norm;
      }
      matrix_multiply<double>(pdVar1 + iVar30,local_88,(int)local_48,local_90,iVar4,pdVar1);
      pdVar1 = local_58;
      local_50 = (double *)((long)local_50 + (long)auVar2);
      lVar19 = local_98;
      for (lVar11 = 0; lVar11 < local_38; lVar11 = lVar11 + 1) {
        for (lVar33 = 0; lVar33 < lVar16; lVar33 = lVar33 + 1) {
          mat_a_00[(int)lVar19 + (int)lVar33] = *(double *)((long)local_50 + lVar33 * 8);
        }
        local_50 = (double *)((long)local_50 + lVar7 * 8);
        lVar19 = lVar19 + (long)norm;
      }
      for (; lVar8 < lVar24; lVar8 = lVar8 + 1) {
        local_a0[lVar8] = 0.0;
      }
      for (sVar10 = 0; __n != sVar10; sVar10 = sVar10 + 8) {
        *(undefined8 *)((long)auVar2 + sVar10 + lVar6) = 0;
      }
      iVar4 = 0;
      lVar19 = local_b0;
      while (bVar34 = lVar19 != 0, lVar19 = lVar19 + -1, bVar34) {
        pdVar9[iVar4] = 1.0;
        iVar4 = iVar4 + iVar13 + 1U;
      }
      lVar6 = (long)auVar2 + lVar25;
      uVar12 = local_120;
      for (lVar19 = 0; lVar19 < lVar29; lVar19 = lVar19 + 1) {
        for (lVar7 = 0; lVar7 < lVar29; lVar7 = lVar7 + 1) {
          pdVar9[(int)uVar12 + (int)lVar7] = *(double *)(lVar6 + lVar7 * 8);
        }
        lVar6 = lVar6 + local_140;
        uVar12 = uVar12 + (long)norm;
      }
      if ((int)local_60 != 0) {
        memmove(local_58,mat_v,__n);
      }
      iVar4 = (int)local_60;
      matrix_multiply<double>(pdVar1,iVar4,iVar4,pdVar9,iVar4,mat_v);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_188);
    }
    iVar3 = local_7c;
    iVar30 = local_80;
    iVar4 = local_84;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_1f8);
    local_b0 = local_b0 + 1;
    local_78 = (ulong)((int)local_78 - 1);
    iVar27 = iVar27 + 1;
    local_b8 = local_b8 + lVar24 + 1;
    pdVar26 = pdVar26 + 1;
    local_c0 = local_c0 + -0x10;
    uVar23 = (ulong)(uint)((int)uVar23 + iVar4);
    local_84 = iVar4 + 2;
    local_158 = local_158 + -8;
    local_130 = local_130 + (ulong)(iVar32 + 1U);
    local_a0 = (double *)((long)local_a0 + local_a8);
    local_98 = local_98 + uVar22;
    iVar18 = iVar18 + iVar30;
    local_80 = iVar30 + 2;
    uVar28 = uVar28 + iVar3;
    local_7c = iVar3 + 2;
    local_3c = local_3c + -1;
    local_120 = local_120 + uVar22;
    local_48 = (ulong)local_68;
  }
  return;
}

Assistant:

void
matrix_bidiagonalize (T const* mat_a, int rows, int cols, T* mat_u,
    T* mat_b, T* mat_v, T const& epsilon)
{
    /* Initialize U and V with identity matrices. */
    matrix_set_identity(mat_u, rows);
    matrix_set_identity(mat_v, cols);

    /* Copy mat_a into mat_b. */
    std::copy(mat_a, mat_a + rows * cols, mat_b);

    int const steps = (rows == cols) ? (cols - 1) : cols;
    for (int k = 0; k < steps; ++k)
    {
        int const sub_length = rows - k;
        std::vector<T> buffer(sub_length // input_vec
            + sub_length // house_vec
            + sub_length * sub_length // house_mat
            + rows * rows // update_u
            + rows * rows); // mat_u_tmp
        T* input_vec = &buffer[0];
        T* house_vec = input_vec + sub_length;
        T* house_mat = house_vec + sub_length;
        T house_beta;
        T* update_u = house_mat + sub_length * sub_length;
        T* mat_u_tmp = update_u + rows * rows;

        for (int i = 0; i < sub_length; ++i)
            input_vec[i] = mat_b[(k + i) * cols + k];

        matrix_householder_vector(input_vec, sub_length, house_vec,
            &house_beta, epsilon, T(1));
        matrix_householder_matrix(house_vec, sub_length,
            house_beta, house_mat);
        matrix_apply_householder_matrix(mat_b, rows, cols,
            house_mat, sub_length, k, k);

        for (int i = k + 1; i < rows; ++i)
            mat_b[i * cols + k] = T(0);

        /* Construct U update matrix and update U. */
        std::fill(update_u, update_u + rows * rows, T(0));
        for (int i = 0; i < k; ++i)
            update_u[i * rows + i] = T(1);
        for (int i = 0; i < sub_length; ++i)
        {
            for (int j = 0; j < sub_length; ++j)
            {
                update_u[(k + i) * rows + (k + j)] =
                    house_mat[i * sub_length + j];
            }
        }

        /* Copy matrix U for multiplication. */
        std::copy(mat_u, mat_u + rows * rows, mat_u_tmp);
        matrix_multiply(mat_u_tmp, rows, rows, update_u, rows, mat_u);

        if (k <= cols - 3)
        {
            /* Normalization constant for numerical stability. */
            T norm(0);
            for (int i = k + 1; i < cols; ++i)
                norm += mat_b[k * cols + i];
            if (MATH_EPSILON_EQ(norm, T(0), epsilon))
                norm = T(1);

            int const inner_sub_length = cols - (k + 1);
            int const slice_rows = rows - k;
            int const slice_cols = cols - k - 1;
            std::vector<T> buffer2(inner_sub_length // inner_input_vec
                + inner_sub_length // inner_house_vec
                + inner_sub_length * inner_sub_length // inner_house_mat
                + slice_rows * slice_cols // mat_b_res
                + slice_rows * slice_cols // mat_b_tmp
                + cols * cols // update_v
                + cols * cols); // mat_v_tmp

            T* inner_input_vec = &buffer2[0];
            T* inner_house_vec = inner_input_vec + inner_sub_length;
            T* inner_house_mat = inner_house_vec + inner_sub_length;
            T inner_house_beta;
            T* mat_b_res = inner_house_mat  + inner_sub_length * inner_sub_length;
            T* mat_b_tmp = mat_b_res + slice_rows * slice_cols;
            T* update_v = mat_b_tmp + slice_rows * slice_cols;
            T* mat_v_tmp = update_v + cols * cols;

            for (int i = 0; i < cols - k - 1; ++i)
                inner_input_vec[i] = mat_b[k * cols + (k + 1 + i)];

            matrix_householder_vector(inner_input_vec, inner_sub_length,
                inner_house_vec, &inner_house_beta, epsilon, norm);
            matrix_householder_matrix(inner_house_vec, inner_sub_length,
                inner_house_beta, inner_house_mat);

            /* Cut out mat_b(k:m, (k+1):n). */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b_tmp[i * slice_cols + j] =
                        mat_b[(k + i) * cols + (k + 1 + j)];
                }
            }
            matrix_multiply(mat_b_tmp, slice_rows, slice_cols,
                inner_house_mat, inner_sub_length, mat_b_res);

            /* Write frame back into mat_b. */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b[(k + i) * cols + (k + 1 + j)] =
                        mat_b_res[i * slice_cols + j];
                }
            }

            for (int i = k + 2; i < cols; ++i)
                mat_b[k * cols + i] = T(0);

            std::fill(update_v, update_v + cols * cols, T(0));
            for (int i = 0; i < k + 1; ++i)
                update_v[i * cols + i] = T(1);
            for (int i = 0; i < inner_sub_length; ++i)
            {
                for (int j = 0; j < inner_sub_length; ++j)
                {
                    update_v[(k + i + 1) * cols + (k + j + 1)] =
                        inner_house_mat[i * inner_sub_length + j];
                }
            }

            /* Copy matrix v for multiplication. */
            std::copy(mat_v, mat_v + cols * cols, mat_v_tmp);
            matrix_multiply(mat_v_tmp, cols, cols, update_v, cols, mat_v);
        }
    }
}